

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int snprintf_error_prot(char *buf,size_t len,canfd_frame *cf)

{
  int iVar1;
  long in_RDX;
  size_t in_RSI;
  char **in_RDI;
  int n;
  size_t unaff_retaddr;
  int local_24;
  undefined4 in_stack_fffffffffffffffc;
  uint8_t err;
  int iVar2;
  
  err = (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18);
  if (in_RSI == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = snprintf((char *)in_RDI,in_RSI,"{{");
    iVar1 = snprintf_error_data((char *)cf,unaff_retaddr,err,in_RDI,(int)(in_RSI >> 0x20));
    iVar1 = iVar1 + iVar2;
    local_24 = snprintf((char *)((long)in_RDI + (long)iVar1),in_RSI - (long)iVar1,"}{");
    local_24 = local_24 + iVar1;
    if ((*(char *)(in_RDX + 0xb) != '\0') && (*(byte *)(in_RDX + 0xb) < 0x20)) {
      iVar2 = snprintf((char *)((long)in_RDI + (long)local_24),in_RSI - (long)local_24,"%s",
                       protocol_violation_locations[*(byte *)(in_RDX + 0xb)]);
      local_24 = iVar2 + local_24;
    }
    iVar2 = snprintf((char *)((long)in_RDI + (long)local_24),in_RSI - (long)local_24,"}}");
    iVar2 = iVar2 + local_24;
  }
  return iVar2;
}

Assistant:

static int snprintf_error_prot(char *buf, size_t len, const struct canfd_frame *cf)
{
	int n = 0;

	if (len <= 0)
		return 0;

	n += snprintf(buf + n, len - n, "{{");
	n += snprintf_error_data(buf + n, len - n, cf->data[2],
				protocol_violation_types,
				ARRAY_SIZE(protocol_violation_types));
	n += snprintf(buf + n, len - n, "}{");
	if (cf->data[3] > 0 &&
	    cf->data[3] < ARRAY_SIZE(protocol_violation_locations))
		n += snprintf(buf + n, len - n, "%s",
			      protocol_violation_locations[cf->data[3]]);
	n += snprintf(buf + n, len - n, "}}");

	return n;
}